

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::SolveStrategy::startAlgo(SolveStrategy *this,SolveMode_t m)

{
  bool bVar1;
  __int_type _Var2;
  uint uVar3;
  Solver *onModel;
  SolveMode_t in_ESI;
  SharedContext *in_RDI;
  double dVar4;
  bool detach;
  bool more;
  int in_stack_00000058;
  bool in_stack_0000005f;
  SolveStrategy *in_stack_00000060;
  undefined2 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined4 in_stack_ffffffffffffffb4;
  __atomic_base<unsigned_int> *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  ClaspFacade *in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffdc;
  SolveAlgorithm *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  byte bVar6;
  undefined1 uVar7;
  SharedContext *this_00;
  undefined4 in_stack_fffffffffffffff8;
  
  uVar7 = 1;
  bVar6 = 1;
  uVar5 = 0;
  this_00 = in_RDI;
  (**(code **)(((ebo *)&in_RDI->satPrepro)->buf + 8))();
  ClaspFacade::interrupt(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_int(in_stack_ffffffffffffffb8);
  if (_Var2 == 0) {
    onModel = SharedContext::master((SharedContext *)0x12174d);
    bVar1 = Solver::hasConflict((Solver *)0x12175e);
    if (!bVar1) {
      dVar4 = RealTime::getTime();
      *(double *)((in_RDI->sccGraph).ptr_ + 0x148) = dVar4;
      *(double *)((in_RDI->sccGraph).ptr_ + 0x140) = dVar4;
      uVar3 = SolveMode_t::operator_cast_to_unsigned_int((SolveMode_t *)&stack0xfffffffffffffffc);
      if ((uVar3 & 2) == 0) {
        SolveAlgorithm::solve
                  ((SolveAlgorithm *)CONCAT44(in_ESI.val_,in_stack_fffffffffffffff8),this_00,
                   (LitVec *)
                   CONCAT17(uVar7,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffffec,
                                                          in_stack_ffffffffffffffe8))),
                   (ModelHandler *)in_stack_ffffffffffffffe0);
      }
      else {
        SolveAlgorithm::start
                  (in_stack_ffffffffffffffe0,
                   (SharedContext *)CONCAT44(in_stack_ffffffffffffffdc,uVar5),(LitVec *)in_RDI,
                   (ModelHandler *)onModel);
        bVar6 = 0;
      }
      goto LAB_0012189d;
    }
  }
  SharedContext::report(this_00,CONCAT13(uVar7,CONCAT12(bVar6,in_stack_ffffffffffffffec)));
  SharedContext::ok((SharedContext *)
                    CONCAT44(in_stack_ffffffffffffffb4,
                             CONCAT13(in_stack_ffffffffffffffb3,
                                      CONCAT12(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0))
                            ));
LAB_0012189d:
  if ((bVar6 & 1) != 0) {
    detachAlgo(in_stack_00000060,in_stack_0000005f,in_stack_00000058,m.val_);
  }
  return;
}

Assistant:

void ClaspFacade::SolveStrategy::startAlgo(SolveMode_t m) {
	bool more = true, detach = true;
	doNotify(event_attach);
	try {
		facade_->interrupt(0); // handle pending interrupts
		if (!signal_ && !facade_->ctx.master()->hasConflict()) {
			facade_->step_.solveTime = facade_->step_.unsatTime = RealTime::getTime();
			if ((m & SolveMode_t::Yield) == 0) {
				more = algo_->solve(facade_->ctx, facade_->assume_, facade_);
			}
			else {
				algo_->start(facade_->ctx, facade_->assume_, facade_);
				detach = false;
			}
		}
		else {
			facade_->ctx.report(Clasp::Event::subsystem_solve);
			more = facade_->ctx.ok();
		}
		if (detach) { detach = false; detachAlgo(more, 0); }
	}
	catch (...) {
		if (detach) { detachAlgo(more, 1); }
		else        { throw; }
	}
}